

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddImage.c
# Opt level: O2

Extra_ImageTree_t *
Extra_bddImageStart(DdManager *dd,DdNode *bCare,int nParts,DdNode **pbParts,int nVars,
                   DdNode **pbVars,int fVerbose)

{
  size_t __size;
  long lVar1;
  DdHalfWord DVar2;
  int iVar3;
  void *pvVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  long lVar10;
  void *__ptr;
  undefined8 *puVar11;
  DdNode **F;
  DdNode *pDVar12;
  void *__ptr_00;
  DdHalfWord *pDVar13;
  DdNode *n;
  void *__ptr_01;
  Extra_ImageTree_t *pEVar14;
  long lVar15;
  Extra_ImageNode_t *pEVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  anon_union_16_2_50f58667_for_type *paVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  Extra_ImageNode_t *pNode2;
  double dVar27;
  double dVar28;
  long local_88;
  long local_50;
  
  if ((fVerbose != 0) && (dd->size < 0x51)) {
    pDVar8 = Cudd_Support(dd,bCare);
    Cudd_Ref(pDVar8);
    pDVar9 = Cudd_bddComputeCube(dd,pbVars,(int *)0x0,nVars);
    Cudd_Ref(pDVar9);
    puts("The latch dependency matrix:");
    printf("Partitions = %d   Variables: total = %d  non-quantifiable = %d\n",(ulong)(uint)nParts,
           (ulong)(uint)dd->size,(ulong)(uint)nVars);
    printf("     : ");
    for (uVar21 = 0; (int)uVar21 < dd->size; uVar21 = uVar21 + 1) {
      printf("%d",(ulong)uVar21 % 10);
    }
    putchar(10);
    uVar23 = 0;
    uVar22 = 0;
    if (0 < nParts) {
      uVar22 = (ulong)(uint)nParts;
    }
    for (; uVar22 != uVar23; uVar23 = uVar23 + 1) {
      Extra_bddImagePrintLatchDependencyOne(dd,pbParts[uVar23],pDVar8,pDVar9,(int)uVar23);
    }
    Extra_bddImagePrintLatchDependencyOne(dd,bCare,pDVar8,pDVar9,nParts);
    Cudd_RecursiveDeref(dd,pDVar8);
    Cudd_RecursiveDeref(dd,pDVar9);
  }
  uVar21 = nParts + 1;
  lVar10 = (long)nParts;
  __size = lVar10 * 8 + 8;
  __ptr = malloc(__size);
  uVar22 = 0;
  uVar23 = 0;
  if (0 < nParts) {
    uVar23 = (ulong)(uint)nParts;
  }
  for (; puVar11 = (undefined8 *)malloc(0x18), uVar23 != uVar22; uVar22 = uVar22 + 1) {
    *(undefined8 **)((long)__ptr + uVar22 * 8) = puVar11;
    pDVar8 = pbParts[uVar22];
    *puVar11 = pDVar8;
    Cudd_Ref(pDVar8);
    pDVar8 = Cudd_Support(dd,(DdNode *)*puVar11);
    puVar11[1] = pDVar8;
    Cudd_Ref(pDVar8);
    iVar6 = Extra_bddSuppSize(dd,(DdNode *)puVar11[1]);
    *(short *)((long)puVar11 + 0x14) = (short)iVar6;
    iVar6 = Cudd_DagSize((DdNode *)*puVar11);
    *(int *)(puVar11 + 2) = iVar6;
    *(short *)((long)puVar11 + 0x16) = (short)uVar22;
  }
  *(undefined8 **)((long)__ptr + lVar10 * 8) = puVar11;
  *puVar11 = bCare;
  Cudd_Ref(bCare);
  pDVar8 = Cudd_Support(dd,(DdNode *)*puVar11);
  puVar11[1] = pDVar8;
  Cudd_Ref(pDVar8);
  iVar6 = Extra_bddSuppSize(dd,(DdNode *)puVar11[1]);
  *(short *)((long)puVar11 + 0x14) = (short)iVar6;
  iVar6 = Cudd_DagSize((DdNode *)*puVar11);
  *(int *)(puVar11 + 2) = iVar6;
  *(short *)((long)puVar11 + 0x16) = (short)nParts;
  F = (DdNode **)malloc(__size);
  uVar23 = 0;
  uVar22 = 0;
  if (0 < (int)uVar21) {
    uVar22 = (ulong)uVar21;
  }
  for (; uVar22 != uVar23; uVar23 = uVar23 + 1) {
    F[uVar23] = *(DdNode **)(*(long *)((long)__ptr + uVar23 * 8) + 8);
  }
  pDVar8 = Cudd_VectorSupport(dd,F,uVar21);
  Cudd_Ref(pDVar8);
  free(F);
  pDVar9 = Cudd_bddComputeCube(dd,pbVars,(int *)0x0,nVars);
  Cudd_Ref(pDVar9);
  pDVar12 = Cudd_bddExistAbstract(dd,pDVar8,pDVar9);
  Cudd_Ref(pDVar12);
  Cudd_RecursiveDeref(dd,pDVar8);
  Cudd_RecursiveDeref(dd,pDVar9);
  Extra_bddSuppSize(dd,pDVar12);
  __ptr_00 = calloc(1,(long)dd->size << 3);
  for (pDVar8 = pDVar12; pDVar9 = dd->one, pDVar8 != pDVar9; pDVar8 = (pDVar8->type).kids.T) {
    DVar2 = pDVar8->index;
    pDVar13 = (DdHalfWord *)malloc(0x18);
    *(DdHalfWord **)((long)__ptr_00 + (long)(int)DVar2 * 8) = pDVar13;
    *pDVar13 = DVar2;
    Cudd_Ref(pDVar9);
    iVar6 = 0;
    for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
      iVar7 = Cudd_bddLeq(dd,*(DdNode **)(*(long *)((long)__ptr + uVar23 * 8) + 8),
                          dd->vars[pDVar8->index]);
      n = pDVar9;
      if (iVar7 != 0) {
        n = Cudd_bddAnd(dd,pDVar9,dd->vars[uVar23]);
        Cudd_Ref(n);
        Cudd_RecursiveDeref(dd,pDVar9);
        iVar6 = iVar6 + 1;
      }
      pDVar9 = n;
    }
    lVar15 = *(long *)((long)__ptr_00 + (long)(int)DVar2 * 8);
    *(DdNode **)(lVar15 + 8) = pDVar9;
    *(int *)(lVar15 + 0x10) = iVar6;
  }
  Cudd_RecursiveDeref(dd,pDVar12);
  uVar21 = dd->size;
  __ptr_01 = malloc(__size);
  for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
    puVar11 = (undefined8 *)calloc(1,0x30);
    *(undefined8 **)((long)__ptr_01 + uVar23 * 8) = puVar11;
    *puVar11 = dd;
    puVar11[5] = *(undefined8 *)((long)__ptr + uVar23 * 8);
  }
  uVar26 = 0;
  uVar23 = (ulong)uVar21;
  if ((int)uVar21 < 1) {
    uVar23 = uVar26;
  }
  for (; uVar23 != uVar26; uVar26 = uVar26 + 1) {
    pvVar4 = *(void **)((long)__ptr_00 + uVar26 * 8);
    if (pvVar4 != (void *)0x0) {
      if (*(int *)((long)pvVar4 + 0x10) < 1) {
        __assert_fail("pVars[v]->nParts > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddImage.c"
                      ,0x1c0,
                      "Extra_ImageNode_t **Extra_CreateNodes(DdManager *, int, Extra_ImagePart_t **, int, Extra_ImageVar_t **)"
                     );
      }
      if (*(int *)((long)pvVar4 + 0x10) == 1) {
        lVar15 = *(long *)((long)__ptr_01 + (long)**(int **)((long)pvVar4 + 8) * 8);
        pDVar8 = *(DdNode **)(lVar15 + 8);
        pDVar9 = dd->vars[uVar26];
        if (pDVar8 == (DdNode *)0x0) {
          *(DdNode **)(lVar15 + 8) = pDVar9;
          Cudd_Ref(pDVar9);
        }
        else {
          pDVar9 = Cudd_bddAnd(dd,pDVar8,pDVar9);
          *(DdNode **)(lVar15 + 8) = pDVar9;
          Cudd_Ref(pDVar9);
          Cudd_RecursiveDeref(dd,pDVar8);
        }
        Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar4 + 8));
        free(pvVar4);
        *(undefined8 *)((long)__ptr_00 + uVar26 * 8) = 0;
      }
    }
  }
  for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
    lVar15 = *(long *)((long)__ptr_01 + uVar23 * 8);
    puVar11 = *(undefined8 **)((long)__ptr + uVar23 * 8);
    if (*(DdNode **)(lVar15 + 8) != (DdNode *)0x0) {
      pDVar8 = (DdNode *)*puVar11;
      pDVar9 = Cudd_bddExistAbstract(dd,pDVar8,*(DdNode **)(lVar15 + 8));
      *puVar11 = pDVar9;
      Cudd_Ref(pDVar9);
      Cudd_RecursiveDeref(dd,pDVar8);
      pDVar8 = (DdNode *)puVar11[1];
      pDVar9 = Cudd_bddExistAbstract(dd,pDVar8,*(DdNode **)(lVar15 + 8));
      puVar11[1] = pDVar9;
      Cudd_Ref(pDVar9);
      Cudd_RecursiveDeref(dd,pDVar8);
      iVar6 = Extra_bddSuppSize(dd,(DdNode *)puVar11[1]);
      *(short *)((long)puVar11 + 0x14) = (short)iVar6;
      iVar6 = Cudd_DagSize((DdNode *)*puVar11);
      *(int *)(puVar11 + 2) = iVar6;
      if ((long)uVar23 < lVar10) {
        Cudd_RecursiveDeref(dd,*(DdNode **)(lVar15 + 8));
        *(undefined8 *)(lVar15 + 8) = 0;
      }
    }
    pDVar8 = (DdNode *)*puVar11;
    *(DdNode **)(lVar15 + 0x10) = pDVar8;
    Cudd_Ref(pDVar8);
  }
  pEVar14 = (Extra_ImageTree_t *)calloc(1,0x28);
  pEVar14->pCare = *(Extra_ImageNode_t **)((long)__ptr_01 + lVar10 * 8);
  pEVar14->fVerbose = fVerbose;
  while( true ) {
    uVar21 = dd->size;
    uVar23 = 0;
    if (0 < (int)uVar21) {
      uVar23 = (ulong)uVar21;
    }
    uVar26 = 0xffffffffffffffff;
    dVar27 = 100000000000000.0;
    for (uVar17 = 0; uVar17 != uVar23; uVar17 = uVar17 + 1) {
      lVar15 = *(long *)((long)__ptr_00 + uVar17 * 8);
      if (lVar15 != 0) {
        dVar28 = 0.0;
        paVar20 = (anon_union_16_2_50f58667_for_type *)(lVar15 + 8);
        while (pDVar8 = (paVar20->kids).T, pDVar8 != dd->one) {
          iVar6 = *(int *)(*(long *)(*(long *)((long)__ptr_01 + (ulong)pDVar8->index * 8) + 0x28) +
                          0x10);
          dVar28 = dVar28 + (double)(iVar6 * iVar6);
          paVar20 = &pDVar8->type;
        }
        if (dVar28 < dVar27) {
          uVar26 = uVar17 & 0xffffffff;
          dVar27 = dVar28;
        }
      }
    }
    if ((int)uVar26 == -1) break;
    lVar15 = (long)(int)uVar26;
    piVar5 = *(int **)((long)__ptr_00 + lVar15 * 8);
    iVar6 = Extra_bddSuppSize(dd,*(DdNode **)(piVar5 + 2));
    if (iVar6 != piVar5[4]) {
      __assert_fail("nSupp == pVar->nParts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddImage.c"
                    ,0x286,
                    "int Extra_BuildTreeNode(DdManager *, int, Extra_ImageNode_t **, int, Extra_ImageVar_t **)"
                   );
    }
    if (iVar6 == 2) {
      local_50 = (long)**(int **)(piVar5 + 2);
      local_88 = (long)**(int **)(*(int **)(piVar5 + 2) + 4);
      pEVar16 = *(Extra_ImageNode_t **)((long)__ptr_01 + local_50 * 8);
      pNode2 = *(Extra_ImageNode_t **)((long)__ptr_01 + local_88 * 8);
      pDVar8 = dd->vars[*piVar5];
      Cudd_Ref(pDVar8);
      for (uVar17 = 0; uVar23 != uVar17; uVar17 = uVar17 + 1) {
        pDVar9 = pDVar8;
        if ((((uVar26 & 0xffffffff) != uVar17) &&
            (piVar5 = *(int **)((long)__ptr_00 + uVar17 * 8), piVar5 != (int *)0x0)) &&
           (*(long *)(piVar5 + 2) == *(long *)(*(long *)((long)__ptr_00 + lVar15 * 8) + 8))) {
          pDVar9 = Cudd_bddAnd(dd,pDVar8,dd->vars[*piVar5]);
          Cudd_Ref(pDVar9);
          Cudd_RecursiveDeref(dd,pDVar8);
          pvVar4 = *(void **)((long)__ptr_00 + uVar17 * 8);
          Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar4 + 8));
          free(pvVar4);
          *(undefined8 *)((long)__ptr_00 + uVar17 * 8) = 0;
        }
        pDVar8 = pDVar9;
      }
      pvVar4 = *(void **)((long)__ptr_00 + lVar15 * 8);
      Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar4 + 8));
      free(pvVar4);
      *(undefined8 *)((long)__ptr_00 + lVar15 * 8) = 0;
      pEVar16 = Extra_CombineTwoNodes(dd,pDVar8,pEVar16,pNode2);
      Cudd_RecursiveDeref(dd,pDVar8);
    }
    else {
      if (iVar6 == 1) {
        __assert_fail("nSupp != 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddImage.c"
                      ,0x287,
                      "int Extra_BuildTreeNode(DdManager *, int, Extra_ImageNode_t **, int, Extra_ImageVar_t **)"
                     );
      }
      paVar20 = (anon_union_16_2_50f58667_for_type *)(piVar5 + 2);
      uVar17 = 0xffffffff;
      uVar26 = 0xffffffffffffffff;
      iVar6 = 1000000;
      iVar7 = 1000000;
      while( true ) {
        pDVar8 = (paVar20->kids).T;
        if (pDVar8 == dd->one) break;
        uVar24 = (ulong)pDVar8->index;
        iVar3 = *(int *)(*(long *)(*(long *)((long)__ptr_01 + uVar24 * 8) + 0x28) + 0x10);
        uVar18 = uVar17;
        iVar25 = iVar3;
        iVar19 = iVar6;
        if (iVar6 <= iVar3) {
          uVar18 = uVar26 & 0xffffffff;
          if (iVar3 < iVar7) {
            uVar18 = uVar24;
          }
          uVar24 = uVar17;
          iVar25 = iVar6;
          iVar19 = iVar3;
          if (iVar7 < iVar3) {
            iVar19 = iVar7;
          }
        }
        uVar17 = uVar24;
        paVar20 = &pDVar8->type;
        uVar26 = uVar18;
        iVar6 = iVar25;
        iVar7 = iVar19;
      }
      local_50 = (long)(int)uVar17;
      pEVar16 = *(Extra_ImageNode_t **)((long)__ptr_01 + local_50 * 8);
      local_88 = (long)(int)uVar26;
      pNode2 = *(Extra_ImageNode_t **)((long)__ptr_01 + local_88 * 8);
      pDVar8 = Cudd_bddAnd(dd,dd->vars[local_50],dd->vars[local_88]);
      Cudd_Ref(pDVar8);
      for (uVar26 = 0; uVar23 != uVar26; uVar26 = uVar26 + 1) {
        lVar15 = *(long *)((long)__ptr_00 + uVar26 * 8);
        if ((lVar15 != 0) && (*(DdNode **)(lVar15 + 8) == pDVar8)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddImage.c"
                        ,0x2b3,
                        "int Extra_BuildTreeNode(DdManager *, int, Extra_ImageNode_t **, int, Extra_ImageVar_t **)"
                       );
        }
      }
      Cudd_RecursiveDeref(dd,pDVar8);
      pEVar16 = Extra_CombineTwoNodes(dd,dd->one,pEVar16,pNode2);
    }
    *(Extra_ImageNode_t **)((long)__ptr_01 + local_50 * 8) = pEVar16;
    *(undefined8 *)((long)__ptr_01 + local_88 * 8) = 0;
    paVar20 = (anon_union_16_2_50f58667_for_type *)&pNode2->pPart->bSupp;
    while (pDVar8 = (paVar20->kids).T, pDVar8 != dd->one) {
      lVar15 = *(long *)((long)__ptr_00 + (ulong)pDVar8->index * 8);
      if (lVar15 != 0) {
        iVar6 = Cudd_bddLeq(dd,*(DdNode **)(lVar15 + 8),dd->vars[local_88]);
        if (iVar6 == 0) {
          __assert_fail("Cudd_bddLeq( dd, pVar->bParts, dd->vars[iNode2] )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddImage.c"
                        ,0x2c5,
                        "int Extra_BuildTreeNode(DdManager *, int, Extra_ImageNode_t **, int, Extra_ImageVar_t **)"
                       );
        }
        pDVar9 = *(DdNode **)(lVar15 + 8);
        pDVar12 = Cudd_bddExistAbstract(dd,pDVar9,dd->vars[local_88]);
        *(DdNode **)(lVar15 + 8) = pDVar12;
        Cudd_Ref(pDVar12);
        Cudd_RecursiveDeref(dd,pDVar9);
        pDVar9 = *(DdNode **)(lVar15 + 8);
        pDVar12 = Cudd_bddAnd(dd,pDVar9,dd->vars[local_50]);
        *(DdNode **)(lVar15 + 8) = pDVar12;
        Cudd_Ref(pDVar12);
        Cudd_RecursiveDeref(dd,pDVar9);
        iVar6 = Extra_bddSuppSize(dd,*(DdNode **)(lVar15 + 8));
        *(int *)(lVar15 + 0x10) = iVar6;
      }
      paVar20 = &pDVar8->type;
    }
  }
  uVar23 = 0;
  uVar26 = (ulong)uVar21;
  if ((int)uVar21 < 1) {
    uVar26 = uVar23;
  }
  while (uVar26 != uVar23) {
    lVar15 = uVar23 * 8;
    uVar23 = uVar23 + 1;
    if (*(long *)((long)__ptr_00 + lVar15) != 0) {
      __assert_fail("pVars[v] == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddImage.c"
                    ,0xba,
                    "Extra_ImageTree_t *Extra_bddImageStart(DdManager *, DdNode *, int, DdNode **, int, DdNode **, int)"
                   );
    }
  }
  free(__ptr_00);
  uVar23 = 0;
  uVar26 = 0xffffffff;
  do {
    while( true ) {
      iVar6 = (int)uVar26;
      uVar17 = (ulong)iVar6;
      if (uVar23 != uVar22) break;
      if (iVar6 == -1) {
        __assert_fail("n1 != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddImage.c"
                      ,0x2ef,
                      "Extra_ImageNode_t *Extra_MergeTopNodes(DdManager *, int, Extra_ImageNode_t **)"
                     );
      }
      pEVar16 = *(Extra_ImageNode_t **)((long)__ptr_01 + uVar17 * 8);
      uVar23 = uVar17;
LAB_006431d6:
      *(undefined8 *)(uVar23 * 8 + (long)__ptr_01) = 0;
      pEVar14->pRoot = pEVar16;
      uVar23 = 0;
      uVar26 = 0xffffffff;
      if (pEVar16 != (Extra_ImageNode_t *)0x0) {
        lVar15 = 0;
        do {
          if (lVar10 < lVar15) {
            free(__ptr_01);
            pDVar8 = Cudd_Support(dd,bCare);
            pEVar14->bCareSupp = pDVar8;
            Cudd_Ref(pDVar8);
            Extra_DeleteParts_rec(pEVar16);
            free(__ptr);
            return pEVar14;
          }
          lVar1 = lVar15 * 8;
          lVar15 = lVar15 + 1;
        } while (*(long *)((long)__ptr_01 + lVar1) == 0);
        __assert_fail("pNodes[v] == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddImage.c"
                      ,0xc2,
                      "Extra_ImageTree_t *Extra_bddImageStart(DdManager *, DdNode *, int, DdNode **, int, DdNode **, int)"
                     );
      }
    }
    if (*(long *)((long)__ptr_01 + uVar23 * 8) != 0) {
      if (iVar6 != -1) {
        uVar23 = uVar23 & 0xffffffff;
        pEVar16 = Extra_CombineTwoNodes
                            (dd,dd->one,*(Extra_ImageNode_t **)((long)__ptr_01 + uVar17 * 8),
                             *(Extra_ImageNode_t **)((long)__ptr_01 + uVar23 * 8));
        *(Extra_ImageNode_t **)((long)__ptr_01 + uVar17 * 8) = pEVar16;
        pEVar16 = (Extra_ImageNode_t *)0x0;
        goto LAB_006431d6;
      }
      uVar26 = uVar23 & 0xffffffff;
    }
    uVar23 = uVar23 + 1;
  } while( true );
}

Assistant:

Extra_ImageTree_t * Extra_bddImageStart( 
    DdManager * dd, DdNode * bCare, // the care set
    int nParts, DdNode ** pbParts,  // the partitions for image computation
    int nVars, DdNode ** pbVars, int fVerbose )   // the NS and parameter variables (not quantified!)
{
    Extra_ImageTree_t * pTree;
    Extra_ImagePart_t ** pParts;
    Extra_ImageVar_t ** pVars;
    Extra_ImageNode_t ** pNodes;
    int v;

    if ( fVerbose && dd->size <= 80 )
        Extra_bddImagePrintLatchDependency( dd, bCare, nParts, pbParts, nVars, pbVars );

    // create variables, partitions and leaf nodes
    pParts = Extra_CreateParts( dd, nParts, pbParts, bCare );
    pVars  = Extra_CreateVars( dd, nParts + 1, pParts, nVars, pbVars );
    pNodes = Extra_CreateNodes( dd, nParts + 1, pParts, dd->size, pVars );
    
    // create the tree
    pTree = ABC_ALLOC( Extra_ImageTree_t, 1 );
    memset( pTree, 0, sizeof(Extra_ImageTree_t) );
    pTree->pCare = pNodes[nParts];
    pTree->fVerbose = fVerbose;

    // process the nodes
    while ( Extra_BuildTreeNode( dd, nParts + 1, pNodes, dd->size, pVars ) );

    // make sure the variables are gone
    for ( v = 0; v < dd->size; v++ )
        assert( pVars[v] == NULL );
    ABC_FREE( pVars );

    // merge the topmost nodes
    while ( (pTree->pRoot = Extra_MergeTopNodes( dd, nParts + 1, pNodes )) == NULL );

    // make sure the nodes are gone
    for ( v = 0; v < nParts + 1; v++ )
        assert( pNodes[v] == NULL );
    ABC_FREE( pNodes );

//    if ( fVerbose )
//        Extra_bddImagePrintTree( pTree );

    // set the support of the care set
    pTree->bCareSupp = Cudd_Support( dd, bCare );  Cudd_Ref( pTree->bCareSupp );

    // clean the partitions
    Extra_DeleteParts_rec( pTree->pRoot );
    ABC_FREE( pParts );
    return pTree;
}